

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDfs.c
# Opt level: O1

int Aig_ConeCountAndMark_rec(Aig_Obj_t *pObj)

{
  int iVar1;
  int iVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                  ,0x2ab,"int Aig_ConeCountAndMark_rec(Aig_Obj_t *)");
  }
  iVar1 = 0;
  if (((*(uint *)&pObj->field_0x18 & 0x10) == 0) &&
     (iVar1 = 0, (*(uint *)&pObj->field_0x18 & 7) - 5 < 2)) {
    iVar1 = Aig_ConeCountAndMark_rec((Aig_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    iVar2 = Aig_ConeCountAndMark_rec((Aig_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    if ((*(ulong *)&pObj->field_0x18 & 0x10) != 0) {
      __assert_fail("!Aig_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDfs.c"
                    ,0x2b0,"int Aig_ConeCountAndMark_rec(Aig_Obj_t *)");
    }
    iVar1 = iVar2 + iVar1 + 1;
    *(ulong *)&pObj->field_0x18 = *(ulong *)&pObj->field_0x18 | 0x10;
  }
  return iVar1;
}

Assistant:

int Aig_ConeCountAndMark_rec( Aig_Obj_t * pObj )
{
    int Counter;
    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) || Aig_ObjIsMarkA(pObj) )
        return 0;
    Counter = 1 + Aig_ConeCountAndMark_rec( Aig_ObjFanin0(pObj) ) + 
        Aig_ConeCountAndMark_rec( Aig_ObjFanin1(pObj) );
    assert( !Aig_ObjIsMarkA(pObj) ); // loop detection
    Aig_ObjSetMarkA( pObj );
    return Counter;
}